

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMarkers.h
# Opt level: O2

ChCoordsys<double> * __thiscall
chrono::ChLinkMarkers::GetLinkRelativeCoords
          (ChCoordsys<double> *__return_storage_ptr__,ChLinkMarkers *this)

{
  ChCoordsys<double>::ChCoordsys
            (__return_storage_ptr__,
             &(this->marker2->super_ChFrameMoving<double>).super_ChFrame<double>.coord);
  return __return_storage_ptr__;
}

Assistant:

virtual ChCoordsys<> GetLinkRelativeCoords() override { return marker2->GetCoord(); }